

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O0

void __thiscall iaf_psc_alpha::calibrate(iaf_psc_alpha *this)

{
  double dVar1;
  long in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double h;
  double in_stack_00000028;
  double in_stack_00000030;
  iaf_psc_alpha *in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  iaf_psc_alpha *in_stack_00000058;
  
  dVar2 = *(double *)(in_RDI + 0x28) * 1000.0;
  dVar3 = exp(-dVar2 / *(double *)(*(long *)(in_RDI + 0x30) + 0x40));
  *(double *)(in_RDI + 0xa0) = dVar3;
  *(double *)(in_RDI + 0x90) = dVar3;
  dVar3 = exp(-dVar2 / *(double *)(*(long *)(in_RDI + 0x30) + 0x48));
  *(double *)(in_RDI + 200) = dVar3;
  *(double *)(in_RDI + 0xb8) = dVar3;
  dVar3 = exp(-dVar2 / **(double **)(in_RDI + 0x30));
  *(double *)(in_RDI + 0xe8) = dVar3;
  dVar3 = expm1(-dVar2 / **(double **)(in_RDI + 0x30));
  *(double *)(in_RDI + 0xf0) = dVar3;
  dVar3 = **(double **)(in_RDI + 0x30);
  dVar1 = *(double *)(*(long *)(in_RDI + 0x30) + 8);
  dVar4 = expm1(-dVar2 / **(double **)(in_RDI + 0x30));
  *(double *)(in_RDI + 0xe0) = (-dVar3 / dVar1) * dVar4;
  *(double *)(in_RDI + 0x98) = dVar2 * *(double *)(in_RDI + 0x90);
  *(double *)(in_RDI + 0xc0) = dVar2 * *(double *)(in_RDI + 0xb8);
  dVar3 = propagator_31(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                        (double)in_stack_00000038);
  *(double *)(in_RDI + 0xa8) = dVar3;
  dVar3 = propagator_32(in_stack_00000038,in_stack_00000030,in_stack_00000028,(double)this,h);
  *(double *)(in_RDI + 0xb0) = dVar3;
  dVar3 = propagator_31(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                        (double)in_stack_00000038);
  *(double *)(in_RDI + 0xd0) = dVar3;
  dVar3 = propagator_32(in_stack_00000038,in_stack_00000030,in_stack_00000028,(double)this,h);
  *(double *)(in_RDI + 0xd8) = dVar3;
  *(double *)(in_RDI + 0x78) = 2.718281828459045 / *(double *)(*(long *)(in_RDI + 0x30) + 0x40);
  *(double *)(in_RDI + 0x80) = 2.718281828459045 / *(double *)(*(long *)(in_RDI + 0x30) + 0x48);
  *(int *)(in_RDI + 0x88) = (int)(*(double *)(*(long *)(in_RDI + 0x30) + 0x10) / dVar2);
  return;
}

Assistant:

void iaf_psc_alpha::calibrate() {
    double h = dt*1000.0;
    
    // these P are independent
    P11_ex_ = P22_ex_ = std::exp(   -h / param->tau_ex_ );
    P11_in_ = P22_in_ = std::exp( -h / param->tau_in_ );

    P33_ = std::exp( -h / param->Tau_ );

    expm1_tau_m_ = std::expm1( -h / param->Tau_ );

    // these depend on the above. Please do not change the order.
    P30_ = -param->Tau_ / param->C_ * std::expm1( -h / param->Tau_ );
    P21_ex_ = h * P11_ex_;
    P21_in_ = h * P11_in_;

    // these are determined according to a numeric stability criterion
    P31_ex_ = propagator_31( param->tau_ex_, param->Tau_, param->C_, h );
    P32_ex_ = propagator_32( param->tau_ex_, param->Tau_, param->C_, h );
    P31_in_ = propagator_31( param->tau_in_, param->Tau_, param->C_, h );
    P32_in_ = propagator_32( param->tau_in_, param->Tau_, param->C_, h );

    EPSCInitialValue_ = 1.0 * M_E / param->tau_ex_;
    IPSCInitialValue_ = 1.0 * M_E / param->tau_in_;

    RefractoryCounts_ = param->TauR_/h;
}